

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

void __thiscall CWire::Enumerate(CWire *this,int iMode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CLayer *pCVar5;
  int local_270;
  int local_25c;
  vector<CSegment_*,_std::allocator<CSegment_*>_> local_170;
  int local_154;
  int local_150;
  int iY;
  int iMaxY;
  int iMinY;
  int local_12c;
  int local_128;
  int iX;
  int iMaxX;
  int iMinX;
  CPoint MidPoint2;
  CPoint MidPoint1;
  int i3rdElbowDir;
  int i2ndElbowDir_1;
  int i1stElbowDir_1;
  vector<CSegment_*,_std::allocator<CSegment_*>_> local_a8;
  undefined1 local_90 [8];
  CPoint MidPoint;
  int i2ndElbowDir;
  int i1stElbowDir;
  vector<CSegment_*,_std::allocator<CSegment_*>_> local_50;
  int local_34;
  int local_30;
  int k;
  int j;
  int i;
  int iDirection;
  int iNumLayer;
  CDesign *pDesign;
  CWire *pCStack_10;
  int iMode_local;
  CWire *this_local;
  
  pDesign._4_4_ = iMode;
  pCStack_10 = this;
  _iDirection = CObject::GetDesign();
  i = CBBox::T(&_iDirection->super_CBBox);
  j = GetDirection(this);
  iVar1 = IsPoint(this);
  if (iVar1 == 0) {
    iVar1 = IsFlat(this);
    if (iVar1 == 0) {
      if ((pDesign._4_4_ & 1) != 0) {
        MidPoint.m_cZ = '\0';
        MidPoint._37_3_ = 0;
        CPoint::CPoint((CPoint *)local_90);
        iVar1 = CPoint::X(this->m_pPointS);
        iVar2 = CPoint::Y(this->m_pPointE);
        iVar3 = CPoint::Z(this->m_pPointS);
        CPoint::Initialize((CPoint *)local_90,iVar1,iVar2,iVar3,(CWire *)0x0);
        iVar1 = CPoint::GetDirection(this->m_pPointS,(CPoint *)local_90);
        iVar2 = CPoint::Z(this->m_pPointE);
        CPoint::SetZ((CPoint *)local_90,iVar2);
        MidPoint._36_4_ = CPoint::GetDirection((CPoint *)local_90,this->m_pPointE);
        for (k = 1; k <= i; k = k + 1) {
          pCVar5 = CDesign::GetLayer(_iDirection,k);
          iVar2 = CLayer::GetDirection(pCVar5);
          if (iVar2 == iVar1) {
            for (local_30 = 1; local_30 <= i; local_30 = local_30 + 1) {
              pCVar5 = CDesign::GetLayer(_iDirection,local_30);
              iVar2 = CLayer::GetDirection(pCVar5);
              if (iVar2 == MidPoint._36_4_) {
                Bend(&local_a8,this,(CPoint *)local_90,k,local_30);
                AddSegmentList(this,&local_a8);
                std::vector<CSegment_*,_std::allocator<CSegment_*>_>::~vector(&local_a8);
              }
            }
          }
        }
        iVar1 = CPoint::X(this->m_pPointE);
        iVar2 = CPoint::Y(this->m_pPointS);
        iVar3 = CPoint::Z(this->m_pPointS);
        CPoint::Initialize((CPoint *)local_90,iVar1,iVar2,iVar3,(CWire *)0x0);
        iVar1 = CPoint::GetDirection(this->m_pPointS,(CPoint *)local_90);
        iVar2 = CPoint::Z(this->m_pPointE);
        CPoint::SetZ((CPoint *)local_90,iVar2);
        MidPoint._36_4_ = CPoint::GetDirection((CPoint *)local_90,this->m_pPointE);
        for (k = 1; k <= i; k = k + 1) {
          pCVar5 = CDesign::GetLayer(_iDirection,k);
          iVar2 = CLayer::GetDirection(pCVar5);
          if (iVar2 == iVar1) {
            for (local_30 = 1; local_30 <= i; local_30 = local_30 + 1) {
              pCVar5 = CDesign::GetLayer(_iDirection,local_30);
              iVar2 = CLayer::GetDirection(pCVar5);
              if (iVar2 == MidPoint._36_4_) {
                Bend((vector<CSegment_*,_std::allocator<CSegment_*>_> *)&i2ndElbowDir_1,this,
                     (CPoint *)local_90,k,local_30);
                AddSegmentList(this,(vector<CSegment_*,_std::allocator<CSegment_*>_> *)
                                    &i2ndElbowDir_1);
                std::vector<CSegment_*,_std::allocator<CSegment_*>_>::~vector
                          ((vector<CSegment_*,_std::allocator<CSegment_*>_> *)&i2ndElbowDir_1);
              }
            }
          }
        }
        CPoint::~CPoint((CPoint *)local_90);
      }
      if ((pDesign._4_4_ & 2) != 0) {
        CPoint::CPoint((CPoint *)&MidPoint2.m_iY);
        CPoint::CPoint((CPoint *)&iMaxX);
        iX = CPoint::X(this->m_pPointS);
        local_128 = CPoint::X(this->m_pPointE);
        local_12c = iX;
        while (local_12c = local_12c + 1, iVar1 = local_12c, local_12c < local_128) {
          iVar2 = CPoint::Y(this->m_pPointS);
          iVar3 = CPoint::Z(this->m_pPointS);
          CPoint::Initialize((CPoint *)&MidPoint2.m_iY,iVar1,iVar2,iVar3,(CWire *)0x0);
          iVar1 = local_12c;
          iVar2 = CPoint::Y(this->m_pPointE);
          iVar3 = CPoint::Z(this->m_pPointS);
          CPoint::Initialize((CPoint *)&iMaxX,iVar1,iVar2,iVar3,(CWire *)0x0);
          iVar1 = CPoint::GetDirection(this->m_pPointS,(CPoint *)&MidPoint2.m_iY);
          iVar2 = CPoint::GetDirection((CPoint *)&MidPoint2.m_iY,(CPoint *)&iMaxX);
          iVar3 = CPoint::Z(this->m_pPointE);
          CPoint::SetZ((CPoint *)&iMaxX,iVar3);
          iVar3 = CPoint::GetDirection((CPoint *)&iMaxX,this->m_pPointE);
          for (k = 1; k <= i; k = k + 1) {
            pCVar5 = CDesign::GetLayer(_iDirection,k);
            iVar4 = CLayer::GetDirection(pCVar5);
            if (iVar4 == iVar1) {
              for (local_30 = 1; local_30 <= i; local_30 = local_30 + 1) {
                pCVar5 = CDesign::GetLayer(_iDirection,local_30);
                iVar4 = CLayer::GetDirection(pCVar5);
                if (iVar4 == iVar2) {
                  for (local_34 = 1; local_34 <= i; local_34 = local_34 + 1) {
                    pCVar5 = CDesign::GetLayer(_iDirection,local_34);
                    iVar4 = CLayer::GetDirection(pCVar5);
                    if (iVar4 == iVar3) {
                      Bend((vector<CSegment_*,_std::allocator<CSegment_*>_> *)&iMaxY,this,
                           (CPoint *)&MidPoint2.m_iY,(CPoint *)&iMaxX,k,local_30,local_34);
                      AddSegmentList(this,(vector<CSegment_*,_std::allocator<CSegment_*>_> *)&iMaxY)
                      ;
                      std::vector<CSegment_*,_std::allocator<CSegment_*>_>::~vector
                                ((vector<CSegment_*,_std::allocator<CSegment_*>_> *)&iMaxY);
                    }
                  }
                }
              }
            }
          }
        }
        iVar1 = CPoint::Y(this->m_pPointS);
        iVar2 = CPoint::Y(this->m_pPointE);
        if (iVar1 < iVar2) {
          local_25c = CPoint::Y(this->m_pPointS);
        }
        else {
          local_25c = CPoint::Y(this->m_pPointE);
        }
        iY = local_25c;
        iVar1 = CPoint::Y(this->m_pPointS);
        iVar2 = CPoint::Y(this->m_pPointE);
        if (iVar2 < iVar1) {
          local_270 = CPoint::Y(this->m_pPointS);
        }
        else {
          local_270 = CPoint::Y(this->m_pPointE);
        }
        local_150 = local_270;
        local_154 = iY;
        while (local_154 = local_154 + 1, local_154 < local_150) {
          iVar2 = CPoint::X(this->m_pPointS);
          iVar1 = local_154;
          iVar3 = CPoint::Z(this->m_pPointS);
          CPoint::Initialize((CPoint *)&MidPoint2.m_iY,iVar2,iVar1,iVar3,(CWire *)0x0);
          iVar2 = CPoint::X(this->m_pPointE);
          iVar1 = local_154;
          iVar3 = CPoint::Z(this->m_pPointS);
          CPoint::Initialize((CPoint *)&iMaxX,iVar2,iVar1,iVar3,(CWire *)0x0);
          iVar1 = CPoint::GetDirection(this->m_pPointS,(CPoint *)&MidPoint2.m_iY);
          iVar2 = CPoint::GetDirection((CPoint *)&MidPoint2.m_iY,(CPoint *)&iMaxX);
          iVar3 = CPoint::Z(this->m_pPointE);
          CPoint::SetZ((CPoint *)&iMaxX,iVar3);
          iVar3 = CPoint::GetDirection((CPoint *)&iMaxX,this->m_pPointE);
          for (k = 1; k <= i; k = k + 1) {
            pCVar5 = CDesign::GetLayer(_iDirection,k);
            iVar4 = CLayer::GetDirection(pCVar5);
            if (iVar4 == iVar1) {
              for (local_30 = 1; local_30 <= i; local_30 = local_30 + 1) {
                pCVar5 = CDesign::GetLayer(_iDirection,local_30);
                iVar4 = CLayer::GetDirection(pCVar5);
                if (iVar4 == iVar2) {
                  for (local_34 = 1; local_34 <= i; local_34 = local_34 + 1) {
                    pCVar5 = CDesign::GetLayer(_iDirection,local_34);
                    iVar4 = CLayer::GetDirection(pCVar5);
                    if (iVar4 == iVar3) {
                      Bend(&local_170,this,(CPoint *)&MidPoint2.m_iY,(CPoint *)&iMaxX,k,local_30,
                           local_34);
                      AddSegmentList(this,&local_170);
                      std::vector<CSegment_*,_std::allocator<CSegment_*>_>::~vector(&local_170);
                    }
                  }
                }
              }
            }
          }
        }
        CPoint::~CPoint((CPoint *)&iMaxX);
        CPoint::~CPoint((CPoint *)&MidPoint2.m_iY);
      }
    }
    else {
      for (k = 1; k <= i; k = k + 1) {
        pCVar5 = CDesign::GetLayer(_iDirection,k);
        iVar1 = CLayer::GetDirection(pCVar5);
        if (iVar1 == j) {
          Bend(&local_50,this,k);
          AddSegmentList(this,&local_50);
          std::vector<CSegment_*,_std::allocator<CSegment_*>_>::~vector(&local_50);
        }
      }
    }
  }
  return;
}

Assistant:

void CWire::Enumerate(int iMode)
{
	CDesign*	pDesign		=	GetDesign();
	int			iNumLayer	=	pDesign->T();
	int			iDirection	=	GetDirection();
	int			i,j,k;

	if(IsPoint())
	{
		
	}
	else if(IsFlat())
	{
		for (i=1;i<=iNumLayer;++i)
		{
			if(pDesign->GetLayer(i)->GetDirection()==iDirection)
			{	
				AddSegmentList(Bend(i));
			}
		}
	}
	else
	{
		//////////////////////////////////////////////////////////////////////////
		// L-shape routing [6/19/2006 thyeros]
		//////////////////////////////////////////////////////////////////////////
		if(iMode&ENUM_MODE_L)
		{
			int	i1stElbowDir	=	DIR_DIAGONAL;
			int	i2ndElbowDir	=	DIR_DIAGONAL;
			
			CPoint	MidPoint;
			
			MidPoint.Initialize(m_pPointS->X(),m_pPointE->Y(),m_pPointS->Z(),NULL);			
			i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint);
			MidPoint.SetZ(m_pPointE->Z());
			i2ndElbowDir	=	MidPoint.GetDirection(m_pPointE);
			
			for (i=LAYER_METAL1;i<=iNumLayer;++i)
			{
				if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
				{				
					for (j=LAYER_METAL1;j<=iNumLayer;++j)
					{
						if(pDesign->GetLayer(j)->GetDirection()==i2ndElbowDir)
						{
							AddSegmentList(Bend(&MidPoint,i,j));	
						}
					}
				}
			}
			
			MidPoint.Initialize(m_pPointE->X(),m_pPointS->Y(),m_pPointS->Z(),NULL);
			i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint);
			MidPoint.SetZ(m_pPointE->Z());
			i2ndElbowDir	=	MidPoint.GetDirection(m_pPointE);
			
			for (i=LAYER_METAL1;i<=iNumLayer;++i)
			{
				if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
				{				
					for (j=LAYER_METAL1;j<=iNumLayer;++j)
					{
						if(pDesign->GetLayer(j)->GetDirection()==i2ndElbowDir)
						{
							AddSegmentList(Bend(&MidPoint,i,j));	
						}
					}
				}
			}

			//// minimum via enumeration [2/9/2007 thyeros]
			//for (i=LAYER_METAL1;i<=iNumLayer;++i)
			//{
			//	if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
			//	{				
			//		int	iLayerBelow	=	i-1;
			//		int	iLayerAbove	=	i+1;

			//		if(iLayerBelow>=LAYER_METAL1&&pDesign->GetLayer(iLayerBelow)->GetDirection()==i2ndElbowDir)	AddSegmentList(Bend(&MidPoint,i,iLayerBelow));	
			//		if(iLayerAbove<=iNumLayer&&pDesign->GetLayer(iLayerAbove)->GetDirection()==i2ndElbowDir)	AddSegmentList(Bend(&MidPoint,i,iLayerAbove));	
			//	}
			//}
			//
			//MidPoint.Initialize(m_pPointE->X(),m_pPointS->Y(),m_pPointS->Z(),NULL);
			//i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint);
			//MidPoint.SetZ(m_pPointE->Z());
			//i2ndElbowDir	=	MidPoint.GetDirection(m_pPointE);
			//
			//for (i=LAYER_METAL1;i<=iNumLayer;++i)
			//{
			//	if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
			//	{				
			//		int	iLayerBelow	=	i-1;
			//		int	iLayerAbove	=	i+1;

			//		if(iLayerBelow>=LAYER_METAL1&&pDesign->GetLayer(iLayerBelow)->GetDirection()==i2ndElbowDir)	AddSegmentList(Bend(&MidPoint,i,iLayerBelow));	
			//		if(iLayerAbove<=iNumLayer&&pDesign->GetLayer(iLayerAbove)->GetDirection()==i2ndElbowDir)	AddSegmentList(Bend(&MidPoint,i,iLayerAbove));	
			//	}
			//}
		}
		
		//////////////////////////////////////////////////////////////////////////
		// Z-shape routing [6/19/2006 thyeros]
		//////////////////////////////////////////////////////////////////////////
		if(iMode&ENUM_MODE_Z)
		{
			int	i1stElbowDir	=	DIR_DIAGONAL;
			int	i2ndElbowDir	=	DIR_DIAGONAL;
			int	i3rdElbowDir	=	DIR_DIAGONAL;
			
			CPoint	MidPoint1,MidPoint2;
			
			// slide X [9/6/2006 thyeros]
			int	iMinX	=	m_pPointS->X();
			int	iMaxX	=	m_pPointE->X();

			for (int iX=iMinX+1;iX<iMaxX;iX++)
			{
				MidPoint1.Initialize(iX,m_pPointS->Y(),m_pPointS->Z(),NULL);
				MidPoint2.Initialize(iX,m_pPointE->Y(),m_pPointS->Z(),NULL);
				
				i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint1);
				i2ndElbowDir	=	MidPoint1.GetDirection(&MidPoint2);
				MidPoint2.SetZ(m_pPointE->Z());
				i3rdElbowDir	=	MidPoint2.GetDirection(m_pPointE);

				for (i=LAYER_METAL1;i<=iNumLayer;++i)
				{
					if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
					{				
						for (j=LAYER_METAL1;j<=iNumLayer;++j)
						{
							if(pDesign->GetLayer(j)->GetDirection()==i2ndElbowDir)
							{
								for (k=LAYER_METAL1;k<=iNumLayer;k++)
								{
									if(pDesign->GetLayer(k)->GetDirection()==i3rdElbowDir)
									{
										AddSegmentList(Bend(&MidPoint1,&MidPoint2,i,j,k));	
									}
								}
							}
						}
					}
				}
			}

			// slide Y [9/6/2006 thyeros]
			int	iMinY	=	MIN(m_pPointS->Y(),m_pPointE->Y());
			int	iMaxY	=	MAX(m_pPointS->Y(),m_pPointE->Y());

			for (int iY=iMinY+1;iY<iMaxY;iY++)
			{
				MidPoint1.Initialize(m_pPointS->X(),iY,m_pPointS->Z(),NULL);
				MidPoint2.Initialize(m_pPointE->X(),iY,m_pPointS->Z(),NULL);
				
				i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint1);
				i2ndElbowDir	=	MidPoint1.GetDirection(&MidPoint2);
				MidPoint2.SetZ(m_pPointE->Z());
				i3rdElbowDir	=	MidPoint2.GetDirection(m_pPointE);

				for (i=LAYER_METAL1;i<=iNumLayer;++i)
				{
					if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
					{				
						for (j=LAYER_METAL1;j<=iNumLayer;++j)
						{
							if(pDesign->GetLayer(j)->GetDirection()==i2ndElbowDir)
							{
								for (k=LAYER_METAL1;k<=iNumLayer;k++)
								{
									if(pDesign->GetLayer(k)->GetDirection()==i3rdElbowDir)
									{
										AddSegmentList(Bend(&MidPoint1,&MidPoint2,i,j,k));	
									}
								}
							}
						}
					}
				}
			}
		}
	}
}